

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fProgramInterfaceQueryTests.cpp
# Opt level: O2

void deqp::gles31::Functional::anon_unknown_0::generateProgramInputLocationBlockContents
               (Context *context,SharedPtr *parentStructure,TestCaseGroup *targetGroup,
               deUint32 presentShadersMask)

{
  NodeType NVar1;
  ShaderType SVar2;
  StorageQualifier *pSVar3;
  Variable *pVVar4;
  ResourceTestCase *pRVar5;
  LayoutQualifier *pLVar6;
  ArrayElement *pAVar7;
  Node *pNVar8;
  SharedPtr *this;
  SharedPtr variable;
  SharedPtr variable_3;
  SharedPtr layout;
  SharedPtr variable_5;
  SharedPtr input;
  ProgramResourceQueryTestTarget local_38;
  
  pNVar8 = parentStructure->m_ptr;
  NVar1 = pNVar8->m_type;
  if (NVar1 == TYPE_DEFAULT_BLOCK) {
    pSVar3 = (StorageQualifier *)operator_new(0x28);
    ResourceDefinition::StorageQualifier::StorageQualifier(pSVar3,parentStructure,STORAGE_IN);
    de::SharedPtr<const_deqp::gles31::Functional::(anonymous_namespace)::ResourceDefinition::Node>::
    SharedPtr(&input,(Node *)pSVar3);
  }
  else {
    input.m_state = parentStructure->m_state;
    input.m_ptr = pNVar8;
    if (input.m_state != (SharedPtrStateBase *)0x0) {
      LOCK();
      (input.m_state)->strongRefCount = (input.m_state)->strongRefCount + 1;
      UNLOCK();
      LOCK();
      (input.m_state)->weakRefCount = (input.m_state)->weakRefCount + 1;
      UNLOCK();
    }
  }
  SVar2 = getShaderMaskFirstStage(presentShadersMask);
  if (SVar2 == SHADERTYPE_FRAGMENT) {
LAB_00504579:
    pVVar4 = (Variable *)operator_new(0x28);
    ResourceDefinition::Variable::Variable(pVVar4,&input,TYPE_FLOAT_VEC4);
    de::SharedPtr<const_deqp::gles31::Functional::(anonymous_namespace)::ResourceDefinition::Node>::
    SharedPtr(&variable,(Node *)pVVar4);
    pRVar5 = (ResourceTestCase *)operator_new(0xb0);
    ProgramResourceQueryTestTarget::ProgramResourceQueryTestTarget
              ((ProgramResourceQueryTestTarget *)&layout,PROGRAMINTERFACE_PROGRAM_INPUT,0x20);
    ResourceTestCase::ResourceTestCase
              (pRVar5,context,&variable,(ProgramResourceQueryTestTarget *)&layout,"var");
    tcu::TestNode::addChild(&targetGroup->super_TestNode,(TestNode *)pRVar5);
    de::SharedPtr<const_deqp::gles31::Functional::(anonymous_namespace)::ResourceDefinition::Node>::
    ~SharedPtr(&variable);
    pLVar6 = (LayoutQualifier *)operator_new(0x38);
    glu::Layout::Layout((Layout *)&variable,2,-1,-1,FORMATLAYOUT_LAST,MATRIXORDER_LAST);
    ResourceDefinition::LayoutQualifier::LayoutQualifier(pLVar6,&input,(Layout *)&variable);
    de::SharedPtr<const_deqp::gles31::Functional::(anonymous_namespace)::ResourceDefinition::Node>::
    SharedPtr(&layout,(Node *)pLVar6);
    pVVar4 = (Variable *)operator_new(0x28);
    ResourceDefinition::Variable::Variable(pVVar4,&layout,TYPE_FLOAT_VEC4);
    de::SharedPtr<const_deqp::gles31::Functional::(anonymous_namespace)::ResourceDefinition::Node>::
    SharedPtr(&variable,(Node *)pVVar4);
    pRVar5 = (ResourceTestCase *)operator_new(0xb0);
    ProgramResourceQueryTestTarget::ProgramResourceQueryTestTarget
              ((ProgramResourceQueryTestTarget *)&variable_3,PROGRAMINTERFACE_PROGRAM_INPUT,0x20);
    ResourceTestCase::ResourceTestCase
              (pRVar5,context,&variable,(ProgramResourceQueryTestTarget *)&variable_3,
               "var_explicit_location");
    tcu::TestNode::addChild(&targetGroup->super_TestNode,(TestNode *)pRVar5);
    de::SharedPtr<const_deqp::gles31::Functional::(anonymous_namespace)::ResourceDefinition::Node>::
    ~SharedPtr(&variable);
    de::SharedPtr<const_deqp::gles31::Functional::(anonymous_namespace)::ResourceDefinition::Node>::
    ~SharedPtr(&layout);
    pNVar8 = (Node *)operator_new(0x20);
    ResourceDefinition::StructMember::StructMember((StructMember *)pNVar8,&input);
    de::SharedPtr<const_deqp::gles31::Functional::(anonymous_namespace)::ResourceDefinition::Node>::
    SharedPtr(&variable,pNVar8);
    pVVar4 = (Variable *)operator_new(0x28);
    ResourceDefinition::Variable::Variable(pVVar4,&variable,TYPE_FLOAT_VEC4);
    de::SharedPtr<const_deqp::gles31::Functional::(anonymous_namespace)::ResourceDefinition::Node>::
    SharedPtr(&layout,(Node *)pVVar4);
    pRVar5 = (ResourceTestCase *)operator_new(0xb0);
    ProgramResourceQueryTestTarget::ProgramResourceQueryTestTarget
              ((ProgramResourceQueryTestTarget *)&variable_3,PROGRAMINTERFACE_PROGRAM_INPUT,0x20);
    ResourceTestCase::ResourceTestCase
              (pRVar5,context,&layout,(ProgramResourceQueryTestTarget *)&variable_3,"var_struct");
    tcu::TestNode::addChild(&targetGroup->super_TestNode,(TestNode *)pRVar5);
    de::SharedPtr<const_deqp::gles31::Functional::(anonymous_namespace)::ResourceDefinition::Node>::
    ~SharedPtr(&layout);
    de::SharedPtr<const_deqp::gles31::Functional::(anonymous_namespace)::ResourceDefinition::Node>::
    ~SharedPtr(&variable);
    pLVar6 = (LayoutQualifier *)operator_new(0x38);
    glu::Layout::Layout((Layout *)&variable,2,-1,-1,FORMATLAYOUT_LAST,MATRIXORDER_LAST);
    ResourceDefinition::LayoutQualifier::LayoutQualifier(pLVar6,&input,(Layout *)&variable);
    de::SharedPtr<const_deqp::gles31::Functional::(anonymous_namespace)::ResourceDefinition::Node>::
    SharedPtr(&layout,(Node *)pLVar6);
    pNVar8 = (Node *)operator_new(0x20);
    ResourceDefinition::StructMember::StructMember((StructMember *)pNVar8,&layout);
    de::SharedPtr<const_deqp::gles31::Functional::(anonymous_namespace)::ResourceDefinition::Node>::
    SharedPtr(&variable,pNVar8);
    pVVar4 = (Variable *)operator_new(0x28);
    ResourceDefinition::Variable::Variable(pVVar4,&variable,TYPE_FLOAT_VEC4);
    de::SharedPtr<const_deqp::gles31::Functional::(anonymous_namespace)::ResourceDefinition::Node>::
    SharedPtr(&variable_3,(Node *)pVVar4);
    pRVar5 = (ResourceTestCase *)operator_new(0xb0);
    ProgramResourceQueryTestTarget::ProgramResourceQueryTestTarget
              ((ProgramResourceQueryTestTarget *)&variable_5,PROGRAMINTERFACE_PROGRAM_INPUT,0x20);
    ResourceTestCase::ResourceTestCase
              (pRVar5,context,&variable_3,(ProgramResourceQueryTestTarget *)&variable_5,
               "var_struct_explicit_location");
    tcu::TestNode::addChild(&targetGroup->super_TestNode,(TestNode *)pRVar5);
    de::SharedPtr<const_deqp::gles31::Functional::(anonymous_namespace)::ResourceDefinition::Node>::
    ~SharedPtr(&variable_3);
    de::SharedPtr<const_deqp::gles31::Functional::(anonymous_namespace)::ResourceDefinition::Node>::
    ~SharedPtr(&variable);
    de::SharedPtr<const_deqp::gles31::Functional::(anonymous_namespace)::ResourceDefinition::Node>::
    ~SharedPtr(&layout);
    pAVar7 = (ArrayElement *)operator_new(0x28);
    ResourceDefinition::ArrayElement::ArrayElement(pAVar7,&input,-1);
    de::SharedPtr<const_deqp::gles31::Functional::(anonymous_namespace)::ResourceDefinition::Node>::
    SharedPtr(&variable,(Node *)pAVar7);
    pVVar4 = (Variable *)operator_new(0x28);
    ResourceDefinition::Variable::Variable(pVVar4,&variable,TYPE_FLOAT_VEC4);
    de::SharedPtr<const_deqp::gles31::Functional::(anonymous_namespace)::ResourceDefinition::Node>::
    SharedPtr(&layout,(Node *)pVVar4);
    pRVar5 = (ResourceTestCase *)operator_new(0xb0);
    ProgramResourceQueryTestTarget::ProgramResourceQueryTestTarget
              ((ProgramResourceQueryTestTarget *)&variable_3,PROGRAMINTERFACE_PROGRAM_INPUT,0x20);
    ResourceTestCase::ResourceTestCase
              (pRVar5,context,&layout,(ProgramResourceQueryTestTarget *)&variable_3,"var_array");
    tcu::TestNode::addChild(&targetGroup->super_TestNode,(TestNode *)pRVar5);
    de::SharedPtr<const_deqp::gles31::Functional::(anonymous_namespace)::ResourceDefinition::Node>::
    ~SharedPtr(&layout);
    de::SharedPtr<const_deqp::gles31::Functional::(anonymous_namespace)::ResourceDefinition::Node>::
    ~SharedPtr(&variable);
    pLVar6 = (LayoutQualifier *)operator_new(0x38);
    glu::Layout::Layout((Layout *)&variable,2,-1,-1,FORMATLAYOUT_LAST,MATRIXORDER_LAST);
    ResourceDefinition::LayoutQualifier::LayoutQualifier(pLVar6,&input,(Layout *)&variable);
    de::SharedPtr<const_deqp::gles31::Functional::(anonymous_namespace)::ResourceDefinition::Node>::
    SharedPtr(&layout,(Node *)pLVar6);
    pAVar7 = (ArrayElement *)operator_new(0x28);
    ResourceDefinition::ArrayElement::ArrayElement(pAVar7,&layout,-1);
    de::SharedPtr<const_deqp::gles31::Functional::(anonymous_namespace)::ResourceDefinition::Node>::
    SharedPtr(&variable,(Node *)pAVar7);
    pVVar4 = (Variable *)operator_new(0x28);
    ResourceDefinition::Variable::Variable(pVVar4,&variable,TYPE_FLOAT_VEC4);
    de::SharedPtr<const_deqp::gles31::Functional::(anonymous_namespace)::ResourceDefinition::Node>::
    SharedPtr(&variable_3,(Node *)pVVar4);
    pRVar5 = (ResourceTestCase *)operator_new(0xb0);
    ProgramResourceQueryTestTarget::ProgramResourceQueryTestTarget
              ((ProgramResourceQueryTestTarget *)&variable_5,PROGRAMINTERFACE_PROGRAM_INPUT,0x20);
    ResourceTestCase::ResourceTestCase
              (pRVar5,context,&variable_3,(ProgramResourceQueryTestTarget *)&variable_5,
               "var_array_explicit_location");
    tcu::TestNode::addChild(&targetGroup->super_TestNode,(TestNode *)pRVar5);
LAB_005049c8:
    de::SharedPtr<const_deqp::gles31::Functional::(anonymous_namespace)::ResourceDefinition::Node>::
    ~SharedPtr(&variable_3);
LAB_005049d2:
    this = &variable;
  }
  else {
    if (SVar2 == SHADERTYPE_VERTEX) {
      pVVar4 = (Variable *)operator_new(0x28);
      ResourceDefinition::Variable::Variable(pVVar4,&input,TYPE_FLOAT_VEC4);
      de::SharedPtr<const_deqp::gles31::Functional::(anonymous_namespace)::ResourceDefinition::Node>
      ::SharedPtr(&variable,(Node *)pVVar4);
      pRVar5 = (ResourceTestCase *)operator_new(0xb0);
      ProgramResourceQueryTestTarget::ProgramResourceQueryTestTarget
                ((ProgramResourceQueryTestTarget *)&layout,PROGRAMINTERFACE_PROGRAM_INPUT,0x20);
      ResourceTestCase::ResourceTestCase
                (pRVar5,context,&variable,(ProgramResourceQueryTestTarget *)&layout,"var");
      tcu::TestNode::addChild(&targetGroup->super_TestNode,(TestNode *)pRVar5);
      de::SharedPtr<const_deqp::gles31::Functional::(anonymous_namespace)::ResourceDefinition::Node>
      ::~SharedPtr(&variable);
      pLVar6 = (LayoutQualifier *)operator_new(0x38);
      glu::Layout::Layout((Layout *)&variable,2,-1,-1,FORMATLAYOUT_LAST,MATRIXORDER_LAST);
      ResourceDefinition::LayoutQualifier::LayoutQualifier(pLVar6,&input,(Layout *)&variable);
      de::SharedPtr<const_deqp::gles31::Functional::(anonymous_namespace)::ResourceDefinition::Node>
      ::SharedPtr(&layout,(Node *)pLVar6);
      pVVar4 = (Variable *)operator_new(0x28);
      ResourceDefinition::Variable::Variable(pVVar4,&layout,TYPE_FLOAT_VEC4);
      de::SharedPtr<const_deqp::gles31::Functional::(anonymous_namespace)::ResourceDefinition::Node>
      ::SharedPtr(&variable,(Node *)pVVar4);
      pRVar5 = (ResourceTestCase *)operator_new(0xb0);
      ProgramResourceQueryTestTarget::ProgramResourceQueryTestTarget
                ((ProgramResourceQueryTestTarget *)&variable_3,PROGRAMINTERFACE_PROGRAM_INPUT,0x20);
      ResourceTestCase::ResourceTestCase
                (pRVar5,context,&variable,(ProgramResourceQueryTestTarget *)&variable_3,
                 "var_explicit_location");
      tcu::TestNode::addChild(&targetGroup->super_TestNode,(TestNode *)pRVar5);
      goto LAB_005049d2;
    }
    if (NVar1 != TYPE_DEFAULT_BLOCK) goto LAB_00504579;
    if ((SVar2 & ~SHADERTYPE_FRAGMENT) == SHADERTYPE_GEOMETRY) {
      pAVar7 = (ArrayElement *)operator_new(0x28);
      ResourceDefinition::ArrayElement::ArrayElement(pAVar7,&input,-2);
      de::SharedPtr<const_deqp::gles31::Functional::(anonymous_namespace)::ResourceDefinition::Node>
      ::SharedPtr(&variable,(Node *)pAVar7);
      pVVar4 = (Variable *)operator_new(0x28);
      ResourceDefinition::Variable::Variable(pVVar4,&variable,TYPE_FLOAT_VEC4);
      de::SharedPtr<const_deqp::gles31::Functional::(anonymous_namespace)::ResourceDefinition::Node>
      ::SharedPtr(&layout,(Node *)pVVar4);
      pRVar5 = (ResourceTestCase *)operator_new(0xb0);
      ProgramResourceQueryTestTarget::ProgramResourceQueryTestTarget
                ((ProgramResourceQueryTestTarget *)&variable_3,PROGRAMINTERFACE_PROGRAM_INPUT,0x20);
      ResourceTestCase::ResourceTestCase
                (pRVar5,context,&layout,(ProgramResourceQueryTestTarget *)&variable_3,"var");
      tcu::TestNode::addChild(&targetGroup->super_TestNode,(TestNode *)pRVar5);
      de::SharedPtr<const_deqp::gles31::Functional::(anonymous_namespace)::ResourceDefinition::Node>
      ::~SharedPtr(&layout);
      de::SharedPtr<const_deqp::gles31::Functional::(anonymous_namespace)::ResourceDefinition::Node>
      ::~SharedPtr(&variable);
      pLVar6 = (LayoutQualifier *)operator_new(0x38);
      glu::Layout::Layout((Layout *)&variable,2,-1,-1,FORMATLAYOUT_LAST,MATRIXORDER_LAST);
      ResourceDefinition::LayoutQualifier::LayoutQualifier(pLVar6,&input,(Layout *)&variable);
      de::SharedPtr<const_deqp::gles31::Functional::(anonymous_namespace)::ResourceDefinition::Node>
      ::SharedPtr(&layout,(Node *)pLVar6);
      pAVar7 = (ArrayElement *)operator_new(0x28);
      ResourceDefinition::ArrayElement::ArrayElement(pAVar7,&layout,-2);
      de::SharedPtr<const_deqp::gles31::Functional::(anonymous_namespace)::ResourceDefinition::Node>
      ::SharedPtr(&variable,(Node *)pAVar7);
      pVVar4 = (Variable *)operator_new(0x28);
      ResourceDefinition::Variable::Variable(pVVar4,&variable,TYPE_FLOAT_VEC4);
      de::SharedPtr<const_deqp::gles31::Functional::(anonymous_namespace)::ResourceDefinition::Node>
      ::SharedPtr(&variable_3,(Node *)pVVar4);
      pRVar5 = (ResourceTestCase *)operator_new(0xb0);
      ProgramResourceQueryTestTarget::ProgramResourceQueryTestTarget
                ((ProgramResourceQueryTestTarget *)&variable_5,PROGRAMINTERFACE_PROGRAM_INPUT,0x20);
      ResourceTestCase::ResourceTestCase
                (pRVar5,context,&variable_3,(ProgramResourceQueryTestTarget *)&variable_5,
                 "var_explicit_location");
      tcu::TestNode::addChild(&targetGroup->super_TestNode,(TestNode *)pRVar5);
      goto LAB_005049c8;
    }
    if (SVar2 != SHADERTYPE_TESSELLATION_EVALUATION) goto LAB_005049e6;
    pSVar3 = (StorageQualifier *)operator_new(0x28);
    ResourceDefinition::StorageQualifier::StorageQualifier(pSVar3,parentStructure,STORAGE_PATCH_IN);
    de::SharedPtr<const_deqp::gles31::Functional::(anonymous_namespace)::ResourceDefinition::Node>::
    SharedPtr(&layout,(Node *)pSVar3);
    pAVar7 = (ArrayElement *)operator_new(0x28);
    ResourceDefinition::ArrayElement::ArrayElement(pAVar7,&input,-2);
    de::SharedPtr<const_deqp::gles31::Functional::(anonymous_namespace)::ResourceDefinition::Node>::
    SharedPtr(&variable,(Node *)pAVar7);
    pVVar4 = (Variable *)operator_new(0x28);
    ResourceDefinition::Variable::Variable(pVVar4,&variable,TYPE_FLOAT_VEC4);
    de::SharedPtr<const_deqp::gles31::Functional::(anonymous_namespace)::ResourceDefinition::Node>::
    SharedPtr(&variable_3,(Node *)pVVar4);
    pRVar5 = (ResourceTestCase *)operator_new(0xb0);
    ProgramResourceQueryTestTarget::ProgramResourceQueryTestTarget
              ((ProgramResourceQueryTestTarget *)&variable_5,PROGRAMINTERFACE_PROGRAM_INPUT,0x20);
    ResourceTestCase::ResourceTestCase
              (pRVar5,context,&variable_3,(ProgramResourceQueryTestTarget *)&variable_5,"var");
    tcu::TestNode::addChild(&targetGroup->super_TestNode,(TestNode *)pRVar5);
    de::SharedPtr<const_deqp::gles31::Functional::(anonymous_namespace)::ResourceDefinition::Node>::
    ~SharedPtr(&variable_3);
    de::SharedPtr<const_deqp::gles31::Functional::(anonymous_namespace)::ResourceDefinition::Node>::
    ~SharedPtr(&variable);
    pLVar6 = (LayoutQualifier *)operator_new(0x38);
    glu::Layout::Layout((Layout *)&variable,2,-1,-1,FORMATLAYOUT_LAST,MATRIXORDER_LAST);
    ResourceDefinition::LayoutQualifier::LayoutQualifier(pLVar6,&input,(Layout *)&variable);
    de::SharedPtr<const_deqp::gles31::Functional::(anonymous_namespace)::ResourceDefinition::Node>::
    SharedPtr(&variable_3,(Node *)pLVar6);
    pAVar7 = (ArrayElement *)operator_new(0x28);
    ResourceDefinition::ArrayElement::ArrayElement(pAVar7,&variable_3,-2);
    de::SharedPtr<const_deqp::gles31::Functional::(anonymous_namespace)::ResourceDefinition::Node>::
    SharedPtr(&variable,(Node *)pAVar7);
    pVVar4 = (Variable *)operator_new(0x28);
    ResourceDefinition::Variable::Variable(pVVar4,&variable,TYPE_FLOAT_VEC4);
    de::SharedPtr<const_deqp::gles31::Functional::(anonymous_namespace)::ResourceDefinition::Node>::
    SharedPtr(&variable_5,(Node *)pVVar4);
    pRVar5 = (ResourceTestCase *)operator_new(0xb0);
    ProgramResourceQueryTestTarget::ProgramResourceQueryTestTarget
              (&local_38,PROGRAMINTERFACE_PROGRAM_INPUT,0x20);
    ResourceTestCase::ResourceTestCase(pRVar5,context,&variable_5,&local_38,"var_explicit_location")
    ;
    tcu::TestNode::addChild(&targetGroup->super_TestNode,(TestNode *)pRVar5);
    de::SharedPtr<const_deqp::gles31::Functional::(anonymous_namespace)::ResourceDefinition::Node>::
    ~SharedPtr(&variable_5);
    de::SharedPtr<const_deqp::gles31::Functional::(anonymous_namespace)::ResourceDefinition::Node>::
    ~SharedPtr(&variable);
    de::SharedPtr<const_deqp::gles31::Functional::(anonymous_namespace)::ResourceDefinition::Node>::
    ~SharedPtr(&variable_3);
    pVVar4 = (Variable *)operator_new(0x28);
    ResourceDefinition::Variable::Variable(pVVar4,&layout,TYPE_FLOAT_VEC4);
    de::SharedPtr<const_deqp::gles31::Functional::(anonymous_namespace)::ResourceDefinition::Node>::
    SharedPtr(&variable,(Node *)pVVar4);
    pRVar5 = (ResourceTestCase *)operator_new(0xb0);
    ProgramResourceQueryTestTarget::ProgramResourceQueryTestTarget
              ((ProgramResourceQueryTestTarget *)&variable_3,PROGRAMINTERFACE_PROGRAM_INPUT,0x20);
    ResourceTestCase::ResourceTestCase
              (pRVar5,context,&variable,(ProgramResourceQueryTestTarget *)&variable_3,"patch_var");
    tcu::TestNode::addChild(&targetGroup->super_TestNode,(TestNode *)pRVar5);
    de::SharedPtr<const_deqp::gles31::Functional::(anonymous_namespace)::ResourceDefinition::Node>::
    ~SharedPtr(&variable);
    pLVar6 = (LayoutQualifier *)operator_new(0x38);
    glu::Layout::Layout((Layout *)&variable,2,-1,-1,FORMATLAYOUT_LAST,MATRIXORDER_LAST);
    ResourceDefinition::LayoutQualifier::LayoutQualifier(pLVar6,&layout,(Layout *)&variable);
    de::SharedPtr<const_deqp::gles31::Functional::(anonymous_namespace)::ResourceDefinition::Node>::
    SharedPtr(&variable_3,(Node *)pLVar6);
    pVVar4 = (Variable *)operator_new(0x28);
    ResourceDefinition::Variable::Variable(pVVar4,&variable_3,TYPE_FLOAT_VEC4);
    de::SharedPtr<const_deqp::gles31::Functional::(anonymous_namespace)::ResourceDefinition::Node>::
    SharedPtr(&variable,(Node *)pVVar4);
    pRVar5 = (ResourceTestCase *)operator_new(0xb0);
    ProgramResourceQueryTestTarget::ProgramResourceQueryTestTarget
              ((ProgramResourceQueryTestTarget *)&variable_5,PROGRAMINTERFACE_PROGRAM_INPUT,0x20);
    ResourceTestCase::ResourceTestCase
              (pRVar5,context,&variable,(ProgramResourceQueryTestTarget *)&variable_5,
               "patch_var_explicit_location");
    tcu::TestNode::addChild(&targetGroup->super_TestNode,(TestNode *)pRVar5);
    de::SharedPtr<const_deqp::gles31::Functional::(anonymous_namespace)::ResourceDefinition::Node>::
    ~SharedPtr(&variable);
    de::SharedPtr<const_deqp::gles31::Functional::(anonymous_namespace)::ResourceDefinition::Node>::
    ~SharedPtr(&variable_3);
    pNVar8 = (Node *)operator_new(0x20);
    ResourceDefinition::StructMember::StructMember((StructMember *)pNVar8,&layout);
    de::SharedPtr<const_deqp::gles31::Functional::(anonymous_namespace)::ResourceDefinition::Node>::
    SharedPtr(&variable,pNVar8);
    pVVar4 = (Variable *)operator_new(0x28);
    ResourceDefinition::Variable::Variable(pVVar4,&variable,TYPE_FLOAT_VEC4);
    de::SharedPtr<const_deqp::gles31::Functional::(anonymous_namespace)::ResourceDefinition::Node>::
    SharedPtr(&variable_3,(Node *)pVVar4);
    pRVar5 = (ResourceTestCase *)operator_new(0xb0);
    ProgramResourceQueryTestTarget::ProgramResourceQueryTestTarget
              ((ProgramResourceQueryTestTarget *)&variable_5,PROGRAMINTERFACE_PROGRAM_INPUT,0x20);
    ResourceTestCase::ResourceTestCase
              (pRVar5,context,&variable_3,(ProgramResourceQueryTestTarget *)&variable_5,
               "patch_var_struct");
    tcu::TestNode::addChild(&targetGroup->super_TestNode,(TestNode *)pRVar5);
    de::SharedPtr<const_deqp::gles31::Functional::(anonymous_namespace)::ResourceDefinition::Node>::
    ~SharedPtr(&variable_3);
    de::SharedPtr<const_deqp::gles31::Functional::(anonymous_namespace)::ResourceDefinition::Node>::
    ~SharedPtr(&variable);
    pLVar6 = (LayoutQualifier *)operator_new(0x38);
    glu::Layout::Layout((Layout *)&variable,2,-1,-1,FORMATLAYOUT_LAST,MATRIXORDER_LAST);
    ResourceDefinition::LayoutQualifier::LayoutQualifier(pLVar6,&layout,(Layout *)&variable);
    de::SharedPtr<const_deqp::gles31::Functional::(anonymous_namespace)::ResourceDefinition::Node>::
    SharedPtr(&variable_3,(Node *)pLVar6);
    pNVar8 = (Node *)operator_new(0x20);
    ResourceDefinition::StructMember::StructMember((StructMember *)pNVar8,&variable_3);
    de::SharedPtr<const_deqp::gles31::Functional::(anonymous_namespace)::ResourceDefinition::Node>::
    SharedPtr(&variable,pNVar8);
    pVVar4 = (Variable *)operator_new(0x28);
    ResourceDefinition::Variable::Variable(pVVar4,&variable,TYPE_FLOAT_VEC4);
    de::SharedPtr<const_deqp::gles31::Functional::(anonymous_namespace)::ResourceDefinition::Node>::
    SharedPtr(&variable_5,(Node *)pVVar4);
    pRVar5 = (ResourceTestCase *)operator_new(0xb0);
    ProgramResourceQueryTestTarget::ProgramResourceQueryTestTarget
              (&local_38,PROGRAMINTERFACE_PROGRAM_INPUT,0x20);
    ResourceTestCase::ResourceTestCase
              (pRVar5,context,&variable_5,&local_38,"patch_var_struct_explicit_location");
    tcu::TestNode::addChild(&targetGroup->super_TestNode,(TestNode *)pRVar5);
    de::SharedPtr<const_deqp::gles31::Functional::(anonymous_namespace)::ResourceDefinition::Node>::
    ~SharedPtr(&variable_5);
    de::SharedPtr<const_deqp::gles31::Functional::(anonymous_namespace)::ResourceDefinition::Node>::
    ~SharedPtr(&variable);
    de::SharedPtr<const_deqp::gles31::Functional::(anonymous_namespace)::ResourceDefinition::Node>::
    ~SharedPtr(&variable_3);
    pAVar7 = (ArrayElement *)operator_new(0x28);
    ResourceDefinition::ArrayElement::ArrayElement(pAVar7,&layout,-1);
    de::SharedPtr<const_deqp::gles31::Functional::(anonymous_namespace)::ResourceDefinition::Node>::
    SharedPtr(&variable,(Node *)pAVar7);
    pVVar4 = (Variable *)operator_new(0x28);
    ResourceDefinition::Variable::Variable(pVVar4,&variable,TYPE_FLOAT_VEC4);
    de::SharedPtr<const_deqp::gles31::Functional::(anonymous_namespace)::ResourceDefinition::Node>::
    SharedPtr(&variable_3,(Node *)pVVar4);
    pRVar5 = (ResourceTestCase *)operator_new(0xb0);
    ProgramResourceQueryTestTarget::ProgramResourceQueryTestTarget
              ((ProgramResourceQueryTestTarget *)&variable_5,PROGRAMINTERFACE_PROGRAM_INPUT,0x20);
    ResourceTestCase::ResourceTestCase
              (pRVar5,context,&variable_3,(ProgramResourceQueryTestTarget *)&variable_5,
               "patch_var_array");
    tcu::TestNode::addChild(&targetGroup->super_TestNode,(TestNode *)pRVar5);
    de::SharedPtr<const_deqp::gles31::Functional::(anonymous_namespace)::ResourceDefinition::Node>::
    ~SharedPtr(&variable_3);
    de::SharedPtr<const_deqp::gles31::Functional::(anonymous_namespace)::ResourceDefinition::Node>::
    ~SharedPtr(&variable);
    pLVar6 = (LayoutQualifier *)operator_new(0x38);
    glu::Layout::Layout((Layout *)&variable,2,-1,-1,FORMATLAYOUT_LAST,MATRIXORDER_LAST);
    ResourceDefinition::LayoutQualifier::LayoutQualifier(pLVar6,&layout,(Layout *)&variable);
    de::SharedPtr<const_deqp::gles31::Functional::(anonymous_namespace)::ResourceDefinition::Node>::
    SharedPtr(&variable_3,(Node *)pLVar6);
    pAVar7 = (ArrayElement *)operator_new(0x28);
    ResourceDefinition::ArrayElement::ArrayElement(pAVar7,&variable_3,-1);
    de::SharedPtr<const_deqp::gles31::Functional::(anonymous_namespace)::ResourceDefinition::Node>::
    SharedPtr(&variable,(Node *)pAVar7);
    pVVar4 = (Variable *)operator_new(0x28);
    ResourceDefinition::Variable::Variable(pVVar4,&variable,TYPE_FLOAT_VEC4);
    de::SharedPtr<const_deqp::gles31::Functional::(anonymous_namespace)::ResourceDefinition::Node>::
    SharedPtr(&variable_5,(Node *)pVVar4);
    pRVar5 = (ResourceTestCase *)operator_new(0xb0);
    ProgramResourceQueryTestTarget::ProgramResourceQueryTestTarget
              (&local_38,PROGRAMINTERFACE_PROGRAM_INPUT,0x20);
    ResourceTestCase::ResourceTestCase
              (pRVar5,context,&variable_5,&local_38,"patch_var_array_explicit_location");
    tcu::TestNode::addChild(&targetGroup->super_TestNode,(TestNode *)pRVar5);
    de::SharedPtr<const_deqp::gles31::Functional::(anonymous_namespace)::ResourceDefinition::Node>::
    ~SharedPtr(&variable_5);
    de::SharedPtr<const_deqp::gles31::Functional::(anonymous_namespace)::ResourceDefinition::Node>::
    ~SharedPtr(&variable);
    this = &variable_3;
  }
  de::SharedPtr<const_deqp::gles31::Functional::(anonymous_namespace)::ResourceDefinition::Node>::
  ~SharedPtr(this);
  de::SharedPtr<const_deqp::gles31::Functional::(anonymous_namespace)::ResourceDefinition::Node>::
  ~SharedPtr(&layout);
LAB_005049e6:
  de::SharedPtr<const_deqp::gles31::Functional::(anonymous_namespace)::ResourceDefinition::Node>::
  ~SharedPtr(&input);
  return;
}

Assistant:

static void generateProgramInputLocationBlockContents (Context& context, const ResourceDefinition::Node::SharedPtr& parentStructure, tcu::TestCaseGroup* targetGroup, deUint32 presentShadersMask)
{
	const bool									inDefaultBlock	= parentStructure->getType() == ResourceDefinition::Node::TYPE_DEFAULT_BLOCK;
	const ResourceDefinition::Node::SharedPtr	input			= (inDefaultBlock)
																	? (ResourceDefinition::Node::SharedPtr(new ResourceDefinition::StorageQualifier(parentStructure, glu::STORAGE_IN)))
																	: (parentStructure);
	const glu::ShaderType						firstStage		= getShaderMaskFirstStage(presentShadersMask);

	if (firstStage == glu::SHADERTYPE_VERTEX)
	{
		// .var
		{
			const ResourceDefinition::Node::SharedPtr variable	(new ResourceDefinition::Variable(input, glu::TYPE_FLOAT_VEC4));
			targetGroup->addChild(new ResourceTestCase(context, variable, ProgramResourceQueryTestTarget(PROGRAMINTERFACE_PROGRAM_INPUT, PROGRAMRESOURCEPROP_LOCATION), "var"));
		}
		// .var_explicit_location
		{
			const ResourceDefinition::Node::SharedPtr layout	(new ResourceDefinition::LayoutQualifier(input, glu::Layout(2)));
			const ResourceDefinition::Node::SharedPtr variable	(new ResourceDefinition::Variable(layout, glu::TYPE_FLOAT_VEC4));
			targetGroup->addChild(new ResourceTestCase(context, variable, ProgramResourceQueryTestTarget(PROGRAMINTERFACE_PROGRAM_INPUT, PROGRAMRESOURCEPROP_LOCATION), "var_explicit_location"));
		}
	}
	else if (firstStage == glu::SHADERTYPE_FRAGMENT || !inDefaultBlock)
	{
		// .var
		{
			const ResourceDefinition::Node::SharedPtr variable	(new ResourceDefinition::Variable(input, glu::TYPE_FLOAT_VEC4));
			targetGroup->addChild(new ResourceTestCase(context, variable, ProgramResourceQueryTestTarget(PROGRAMINTERFACE_PROGRAM_INPUT, PROGRAMRESOURCEPROP_LOCATION), "var"));
		}
		// .var_explicit_location
		{
			const ResourceDefinition::Node::SharedPtr layout	(new ResourceDefinition::LayoutQualifier(input, glu::Layout(2)));
			const ResourceDefinition::Node::SharedPtr variable	(new ResourceDefinition::Variable(layout, glu::TYPE_FLOAT_VEC4));
			targetGroup->addChild(new ResourceTestCase(context, variable, ProgramResourceQueryTestTarget(PROGRAMINTERFACE_PROGRAM_INPUT, PROGRAMRESOURCEPROP_LOCATION), "var_explicit_location"));
		}
		// .var_struct
		{
			const ResourceDefinition::Node::SharedPtr structMbr	(new ResourceDefinition::StructMember(input));
			const ResourceDefinition::Node::SharedPtr variable	(new ResourceDefinition::Variable(structMbr, glu::TYPE_FLOAT_VEC4));
			targetGroup->addChild(new ResourceTestCase(context, variable, ProgramResourceQueryTestTarget(PROGRAMINTERFACE_PROGRAM_INPUT, PROGRAMRESOURCEPROP_LOCATION), "var_struct"));
		}
		// .var_struct_explicit_location
		{
			const ResourceDefinition::Node::SharedPtr layout	(new ResourceDefinition::LayoutQualifier(input, glu::Layout(2)));
			const ResourceDefinition::Node::SharedPtr structMbr	(new ResourceDefinition::StructMember(layout));
			const ResourceDefinition::Node::SharedPtr variable	(new ResourceDefinition::Variable(structMbr, glu::TYPE_FLOAT_VEC4));
			targetGroup->addChild(new ResourceTestCase(context, variable, ProgramResourceQueryTestTarget(PROGRAMINTERFACE_PROGRAM_INPUT, PROGRAMRESOURCEPROP_LOCATION), "var_struct_explicit_location"));
		}
		// .var_array
		{
			const ResourceDefinition::Node::SharedPtr arrayElem	(new ResourceDefinition::ArrayElement(input));
			const ResourceDefinition::Node::SharedPtr variable	(new ResourceDefinition::Variable(arrayElem, glu::TYPE_FLOAT_VEC4));
			targetGroup->addChild(new ResourceTestCase(context, variable, ProgramResourceQueryTestTarget(PROGRAMINTERFACE_PROGRAM_INPUT, PROGRAMRESOURCEPROP_LOCATION), "var_array"));
		}
		// .var_array_explicit_location
		{
			const ResourceDefinition::Node::SharedPtr layout	(new ResourceDefinition::LayoutQualifier(input, glu::Layout(2)));
			const ResourceDefinition::Node::SharedPtr arrayElem	(new ResourceDefinition::ArrayElement(layout));
			const ResourceDefinition::Node::SharedPtr variable	(new ResourceDefinition::Variable(arrayElem, glu::TYPE_FLOAT_VEC4));
			targetGroup->addChild(new ResourceTestCase(context, variable, ProgramResourceQueryTestTarget(PROGRAMINTERFACE_PROGRAM_INPUT, PROGRAMRESOURCEPROP_LOCATION), "var_array_explicit_location"));
		}
	}
	else if (firstStage == glu::SHADERTYPE_TESSELLATION_CONTROL ||
			 firstStage == glu::SHADERTYPE_GEOMETRY)
	{
		// arrayed interface

		// .var
		{
			const ResourceDefinition::Node::SharedPtr arrayElem	(new ResourceDefinition::ArrayElement(input, ResourceDefinition::ArrayElement::UNSIZED_ARRAY));
			const ResourceDefinition::Node::SharedPtr variable	(new ResourceDefinition::Variable(arrayElem, glu::TYPE_FLOAT_VEC4));
			targetGroup->addChild(new ResourceTestCase(context, variable, ProgramResourceQueryTestTarget(PROGRAMINTERFACE_PROGRAM_INPUT, PROGRAMRESOURCEPROP_LOCATION), "var"));
		}
		// .var_explicit_location
		{
			const ResourceDefinition::Node::SharedPtr layout	(new ResourceDefinition::LayoutQualifier(input, glu::Layout(2)));
			const ResourceDefinition::Node::SharedPtr arrayElem	(new ResourceDefinition::ArrayElement(layout, ResourceDefinition::ArrayElement::UNSIZED_ARRAY));
			const ResourceDefinition::Node::SharedPtr variable	(new ResourceDefinition::Variable(arrayElem, glu::TYPE_FLOAT_VEC4));
			targetGroup->addChild(new ResourceTestCase(context, variable, ProgramResourceQueryTestTarget(PROGRAMINTERFACE_PROGRAM_INPUT, PROGRAMRESOURCEPROP_LOCATION), "var_explicit_location"));
		}
		// extension forbids use arrays of structs
		// extension forbids use arrays of arrays
	}
	else if (firstStage == glu::SHADERTYPE_TESSELLATION_EVALUATION)
	{
		// arrayed interface
		const ResourceDefinition::Node::SharedPtr patchInput(new ResourceDefinition::StorageQualifier(parentStructure, glu::STORAGE_PATCH_IN));

		// .var
		{
			const ResourceDefinition::Node::SharedPtr arrayElem	(new ResourceDefinition::ArrayElement(input, ResourceDefinition::ArrayElement::UNSIZED_ARRAY));
			const ResourceDefinition::Node::SharedPtr variable	(new ResourceDefinition::Variable(arrayElem, glu::TYPE_FLOAT_VEC4));
			targetGroup->addChild(new ResourceTestCase(context, variable, ProgramResourceQueryTestTarget(PROGRAMINTERFACE_PROGRAM_INPUT, PROGRAMRESOURCEPROP_LOCATION), "var"));
		}
		// .var_explicit_location
		{
			const ResourceDefinition::Node::SharedPtr layout	(new ResourceDefinition::LayoutQualifier(input, glu::Layout(2)));
			const ResourceDefinition::Node::SharedPtr arrayElem	(new ResourceDefinition::ArrayElement(layout, ResourceDefinition::ArrayElement::UNSIZED_ARRAY));
			const ResourceDefinition::Node::SharedPtr variable	(new ResourceDefinition::Variable(arrayElem, glu::TYPE_FLOAT_VEC4));
			targetGroup->addChild(new ResourceTestCase(context, variable, ProgramResourceQueryTestTarget(PROGRAMINTERFACE_PROGRAM_INPUT, PROGRAMRESOURCEPROP_LOCATION), "var_explicit_location"));
		}
		// extension forbids use arrays of structs
		// extension forbids use arrays of arrays

		// .patch_var
		{
			const ResourceDefinition::Node::SharedPtr variable	(new ResourceDefinition::Variable(patchInput, glu::TYPE_FLOAT_VEC4));
			targetGroup->addChild(new ResourceTestCase(context, variable, ProgramResourceQueryTestTarget(PROGRAMINTERFACE_PROGRAM_INPUT, PROGRAMRESOURCEPROP_LOCATION), "patch_var"));
		}
		// .patch_var_explicit_location
		{
			const ResourceDefinition::Node::SharedPtr layout	(new ResourceDefinition::LayoutQualifier(patchInput, glu::Layout(2)));
			const ResourceDefinition::Node::SharedPtr variable	(new ResourceDefinition::Variable(layout, glu::TYPE_FLOAT_VEC4));
			targetGroup->addChild(new ResourceTestCase(context, variable, ProgramResourceQueryTestTarget(PROGRAMINTERFACE_PROGRAM_INPUT, PROGRAMRESOURCEPROP_LOCATION), "patch_var_explicit_location"));
		}
		// .patch_var_struct
		{
			const ResourceDefinition::Node::SharedPtr structMbr	(new ResourceDefinition::StructMember(patchInput));
			const ResourceDefinition::Node::SharedPtr variable	(new ResourceDefinition::Variable(structMbr, glu::TYPE_FLOAT_VEC4));
			targetGroup->addChild(new ResourceTestCase(context, variable, ProgramResourceQueryTestTarget(PROGRAMINTERFACE_PROGRAM_INPUT, PROGRAMRESOURCEPROP_LOCATION), "patch_var_struct"));
		}
		// .patch_var_struct_explicit_location
		{
			const ResourceDefinition::Node::SharedPtr layout	(new ResourceDefinition::LayoutQualifier(patchInput, glu::Layout(2)));
			const ResourceDefinition::Node::SharedPtr structMbr	(new ResourceDefinition::StructMember(layout));
			const ResourceDefinition::Node::SharedPtr variable	(new ResourceDefinition::Variable(structMbr, glu::TYPE_FLOAT_VEC4));
			targetGroup->addChild(new ResourceTestCase(context, variable, ProgramResourceQueryTestTarget(PROGRAMINTERFACE_PROGRAM_INPUT, PROGRAMRESOURCEPROP_LOCATION), "patch_var_struct_explicit_location"));
		}
		// .patch_var_array
		{
			const ResourceDefinition::Node::SharedPtr arrayElem	(new ResourceDefinition::ArrayElement(patchInput));
			const ResourceDefinition::Node::SharedPtr variable	(new ResourceDefinition::Variable(arrayElem, glu::TYPE_FLOAT_VEC4));
			targetGroup->addChild(new ResourceTestCase(context, variable, ProgramResourceQueryTestTarget(PROGRAMINTERFACE_PROGRAM_INPUT, PROGRAMRESOURCEPROP_LOCATION), "patch_var_array"));
		}
		// .patch_var_array_explicit_location
		{
			const ResourceDefinition::Node::SharedPtr layout	(new ResourceDefinition::LayoutQualifier(patchInput, glu::Layout(2)));
			const ResourceDefinition::Node::SharedPtr arrayElem	(new ResourceDefinition::ArrayElement(layout));
			const ResourceDefinition::Node::SharedPtr variable	(new ResourceDefinition::Variable(arrayElem, glu::TYPE_FLOAT_VEC4));
			targetGroup->addChild(new ResourceTestCase(context, variable, ProgramResourceQueryTestTarget(PROGRAMINTERFACE_PROGRAM_INPUT, PROGRAMRESOURCEPROP_LOCATION), "patch_var_array_explicit_location"));
		}
	}
	else if (firstStage == glu::SHADERTYPE_COMPUTE)
	{
		// nada
	}
	else
		DE_ASSERT(false);
}